

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::BackUp(CopyingOutputStreamAdaptor *this,int count)

{
  int iVar1;
  LogMessage *pLVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (count < 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x186);
    pLVar2 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (count) >= (0): ");
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
  }
  iVar1 = this->buffer_used_;
  if (iVar1 != this->buffer_size_) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x187);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (buffer_used_) == (buffer_size_): ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2," BackUp() can only be called after Next().");
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
    iVar1 = this->buffer_used_;
  }
  if (iVar1 < count) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x189);
    pLVar2 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (count) <= (buffer_used_): ")
    ;
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,
                        " Can\'t back up over more bytes than were returned by the last call to Next()."
                       );
    internal::LogFinisher::operator=(&local_51,pLVar2);
    internal::LogMessage::~LogMessage(&local_50);
    iVar1 = this->buffer_used_;
  }
  this->buffer_used_ = iVar1 - count;
  return;
}

Assistant:

void CopyingOutputStreamAdaptor::BackUp(int count) {
  GOOGLE_CHECK_GE(count, 0);
  GOOGLE_CHECK_EQ(buffer_used_, buffer_size_)
    << " BackUp() can only be called after Next().";
  GOOGLE_CHECK_LE(count, buffer_used_)
    << " Can't back up over more bytes than were returned by the last call"
       " to Next().";

  buffer_used_ -= count;
}